

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrs.cpp
# Opt level: O1

UBool __thiscall
icu_63::NFRuleSet::parse
          (NFRuleSet *this,UnicodeString *text,ParsePosition *pos,double upperBound,
          uint32_t nonNumericalExecutedRuleMask,Formattable *result)

{
  short sVar1;
  UnicodeString *text_00;
  UBool UVar2;
  int iVar3;
  int i;
  long lVar4;
  ParsePosition workingPos;
  ParsePosition highWaterMark;
  Formattable tempResult;
  ParsePosition local_e0;
  ParsePosition local_d0;
  double local_c0;
  Formattable *local_b8;
  UnicodeString *local_b0;
  long local_a8;
  Formattable local_a0;
  
  UVar2 = '\0';
  local_c0 = upperBound;
  local_b8 = result;
  Formattable::setLong(result,0);
  sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar3 = (text->fUnion).fFields.fLength;
  }
  else {
    iVar3 = (int)sVar1 >> 5;
  }
  if (iVar3 != 0) {
    local_d0.super_UObject._vptr_UObject = (_func_int **)&PTR__ParsePosition_003dcfb8;
    local_d0.index = 0;
    local_d0.errorIndex = -1;
    local_e0.super_UObject._vptr_UObject = (_func_int **)&PTR__ParsePosition_003dcfb8;
    local_e0.index = pos->index;
    local_e0.errorIndex = pos->errorIndex;
    lVar4 = 0;
    local_b0 = text;
    do {
      if ((this->nonNumericalRules[lVar4] != (NFRule *)0x0) &&
         ((nonNumericalExecutedRuleMask >> ((uint)lVar4 & 0x1f) & 1) == 0)) {
        Formattable::Formattable(&local_a0);
        nonNumericalExecutedRuleMask = nonNumericalExecutedRuleMask | 1 << ((byte)lVar4 & 0x1f);
        UVar2 = NFRule::doParse(this->nonNumericalRules[lVar4],local_b0,&local_e0,'\0',local_c0,
                                nonNumericalExecutedRuleMask,&local_a0);
        if ((UVar2 != '\0') && (local_d0.index < local_e0.index)) {
          Formattable::operator=(local_b8,&local_a0);
          local_d0.errorIndex = local_e0.errorIndex;
          local_d0.index = local_e0.index;
        }
        local_e0.index = pos->index;
        local_e0.errorIndex = pos->errorIndex;
        Formattable::~Formattable(&local_a0);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 6);
    local_a8 = util64_fromDouble(local_c0);
    text_00 = local_b0;
    lVar4 = (long)(int)(this->rules).fCount;
    if (0 < lVar4) {
      lVar4 = lVar4 + 1;
      do {
        sVar1 = (text_00->fUnion).fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar3 = (text_00->fUnion).fFields.fLength;
        }
        else {
          iVar3 = (int)sVar1 >> 5;
        }
        if (iVar3 <= local_d0.index) break;
        if ((this->fIsFractionRuleSet != '\0') ||
           ((this->rules).fStuff[lVar4 + -2]->baseValue < local_a8)) {
          Formattable::Formattable(&local_a0);
          UVar2 = NFRule::doParse((this->rules).fStuff[lVar4 + -2],text_00,&local_e0,
                                  this->fIsFractionRuleSet,local_c0,nonNumericalExecutedRuleMask,
                                  &local_a0);
          if ((UVar2 != '\0') && (local_d0.index < local_e0.index)) {
            Formattable::operator=(local_b8,&local_a0);
            local_d0.errorIndex = local_e0.errorIndex;
            local_d0.index = local_e0.index;
          }
          local_e0.index = pos->index;
          local_e0.errorIndex = pos->errorIndex;
          Formattable::~Formattable(&local_a0);
        }
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    pos->index = local_d0.index;
    pos->errorIndex = local_d0.errorIndex;
    ParsePosition::~ParsePosition(&local_e0);
    ParsePosition::~ParsePosition(&local_d0);
    UVar2 = '\x01';
  }
  return UVar2;
}

Assistant:

UBool
NFRuleSet::parse(const UnicodeString& text, ParsePosition& pos, double upperBound, uint32_t nonNumericalExecutedRuleMask, Formattable& result) const
{
    // try matching each rule in the rule set against the text being
    // parsed.  Whichever one matches the most characters is the one
    // that determines the value we return.

    result.setLong(0);

    // dump out if there's no text to parse
    if (text.length() == 0) {
        return 0;
    }

    ParsePosition highWaterMark;
    ParsePosition workingPos = pos;

#ifdef RBNF_DEBUG
    fprintf(stderr, "<nfrs> %x '", this);
    dumpUS(stderr, name);
    fprintf(stderr, "' text '");
    dumpUS(stderr, text);
    fprintf(stderr, "'\n");
    fprintf(stderr, "  parse negative: %d\n", this, negativeNumberRule != 0);
#endif
    // Try each of the negative rules, fraction rules, infinity rules and NaN rules
    for (int i = 0; i < NON_NUMERICAL_RULE_LENGTH; i++) {
        if (nonNumericalRules[i] && ((nonNumericalExecutedRuleMask >> i) & 1) == 0) {
            // Mark this rule as being executed so that we don't try to execute it again.
            nonNumericalExecutedRuleMask |= 1 << i;

            Formattable tempResult;
            UBool success = nonNumericalRules[i]->doParse(text, workingPos, 0, upperBound, nonNumericalExecutedRuleMask, tempResult);
            if (success && (workingPos.getIndex() > highWaterMark.getIndex())) {
                result = tempResult;
                highWaterMark = workingPos;
            }
            workingPos = pos;
        }
    }
#ifdef RBNF_DEBUG
    fprintf(stderr, "<nfrs> continue other with text '");
    dumpUS(stderr, text);
    fprintf(stderr, "' hwm: %d\n", highWaterMark.getIndex());
#endif

    // finally, go through the regular rules one at a time.  We start
    // at the end of the list because we want to try matching the most
    // sigificant rule first (this helps ensure that we parse
    // "five thousand three hundred six" as
    // "(five thousand) (three hundred) (six)" rather than
    // "((five thousand three) hundred) (six)").  Skip rules whose
    // base values are higher than the upper bound (again, this helps
    // limit ambiguity by making sure the rules that match a rule's
    // are less significant than the rule containing the substitutions)/
    {
        int64_t ub = util64_fromDouble(upperBound);
#ifdef RBNF_DEBUG
        {
            char ubstr[64];
            util64_toa(ub, ubstr, 64);
            char ubstrhex[64];
            util64_toa(ub, ubstrhex, 64, 16);
            fprintf(stderr, "ub: %g, i64: %s (%s)\n", upperBound, ubstr, ubstrhex);
        }
#endif
        for (int32_t i = rules.size(); --i >= 0 && highWaterMark.getIndex() < text.length();) {
            if ((!fIsFractionRuleSet) && (rules[i]->getBaseValue() >= ub)) {
                continue;
            }
            Formattable tempResult;
            UBool success = rules[i]->doParse(text, workingPos, fIsFractionRuleSet, upperBound, nonNumericalExecutedRuleMask, tempResult);
            if (success && workingPos.getIndex() > highWaterMark.getIndex()) {
                result = tempResult;
                highWaterMark = workingPos;
            }
            workingPos = pos;
        }
    }
#ifdef RBNF_DEBUG
    fprintf(stderr, "<nfrs> exit\n");
#endif
    // finally, update the parse postion we were passed to point to the
    // first character we didn't use, and return the result that
    // corresponds to that string of characters
    pos = highWaterMark;

    return 1;
}